

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_compressionStage_e ZVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  XXH64_hash_t XVar6;
  char cVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 *puVar10;
  size_t sVar11;
  undefined4 *puVar12;
  
  sVar5 = ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  sVar11 = sVar5;
  if (sVar5 < 0xffffffffffffff89) {
    ZVar1 = cctx->stage;
    if (ZVar1 == ZSTDcs_created) {
      sVar11 = 0xffffffffffffffc4;
    }
    else {
      puVar12 = (undefined4 *)((long)dst + sVar5);
      uVar9 = dstCapacity - sVar5;
      puVar10 = puVar12;
      if (ZVar1 != ZSTDcs_ending) {
        if (ZVar1 == ZSTDcs_init) {
          iVar2 = (cctx->appliedParams).fParams.contentSizeFlag;
          iVar3 = (cctx->appliedParams).fParams.checksumFlag;
          if (uVar9 < 0x12) {
            return 0xffffffffffffffba;
          }
          uVar4 = (cctx->appliedParams).cParams.windowLog;
          if ((cctx->appliedParams).format == ZSTD_f_zstd1) {
            *puVar12 = 0xfd2fb528;
            uVar8 = 4;
          }
          else {
            uVar8 = 0;
          }
          puVar10 = (undefined4 *)((long)puVar12 + uVar8 + 5);
          *(char *)((long)puVar10 + -5) = (iVar2 != 0) << 5 | (0 < iVar3) << 2;
          cVar7 = '\0';
          if (iVar2 == 0) {
            cVar7 = (char)uVar4 * '\b' + -0x50;
          }
          *(char *)(puVar10 + -1) = cVar7;
          cctx->stage = ZSTDcs_ongoing;
          *(undefined4 *)((long)puVar10 + -3) = 1;
          uVar9 = uVar9 - (uVar8 | 2);
        }
        else {
          if (uVar9 < 4) {
            return 0xffffffffffffffba;
          }
          *puVar12 = 1;
          puVar10 = (undefined4 *)((long)puVar12 + 3);
        }
        uVar9 = uVar9 - 3;
      }
      if ((cctx->appliedParams).fParams.checksumFlag != 0) {
        XVar6 = XXH64_digest(&cctx->xxhState);
        if (uVar9 < 4) {
          return 0xffffffffffffffba;
        }
        *puVar10 = (int)XVar6;
        puVar10 = puVar10 + 1;
      }
      cctx->stage = ZSTDcs_created;
      uVar9 = (long)puVar10 - (long)puVar12;
      sVar11 = uVar9;
      if ((uVar9 < 0xffffffffffffff89) &&
         ((cctx->pledgedSrcSizePlusOne == 0 ||
          (sVar11 = 0xffffffffffffffb8, cctx->pledgedSrcSizePlusOne == cctx->consumedSrcSize + 1))))
      {
        sVar11 = uVar9 + sVar5;
      }
    }
  }
  return sVar11;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    if (ZSTD_isError(cSize)) return cSize;
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    if (ZSTD_isError(endResult)) return endResult;
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        if (cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1) {
            DEBUGLOG(4, "error : pledgedSrcSize = %u, while realSrcSize = %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1, (unsigned)cctx->consumedSrcSize);
            return ERROR(srcSize_wrong);
    }   }
    return cSize + endResult;
}